

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O0

void __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CosId>_>
::ConsiderIntegrality
          (BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CosId>_>
           *this)

{
  int iVar1;
  int iVar2;
  long *in_RDI;
  PLPoints *this_00;
  double x;
  int k;
  int N;
  double xN;
  double x0;
  PLPoints *in_stack_ffffffffffffffc0;
  int iVar3;
  
  if (((*(byte *)(in_RDI[2] + 0x20) & 1) != 0) && ((*(byte *)(in_RDI[2] + 0x80) & 1) == 0)) {
    this_00 = (PLPoints *)ceil(*(double *)(in_RDI[2] + 0x30));
    x = floor(*(double *)(in_RDI[2] + 0x38));
    iVar2 = (int)((x - (double)this_00) + 1.0);
    iVar3 = iVar2;
    iVar1 = PLPoints::size((PLPoints *)0x731df3);
    if (iVar2 <= iVar1) {
      PLPoints::clear(in_stack_ffffffffffffffc0);
      for (iVar1 = 0; iVar1 < iVar3; iVar1 = iVar1 + 1) {
        (**(code **)(*in_RDI + 0x48))((double)this_00 + (double)iVar1);
        PLPoints::AddPoint(this_00,x,(double)CONCAT44(iVar3,iVar1));
      }
    }
  }
  return;
}

Assistant:

void BasicPLApproximator<FuncCon>::ConsiderIntegrality() {
  /// Simple case when N breakpoints >= N integer points
  if (laPrm_.is_x_int && !laPrm_.fUsePeriod) {
    auto x0=std::ceil(laPrm_.grDomOut.lbx);
    auto xN=std::floor(laPrm_.grDomOut.ubx);
    auto N = int(xN - x0 + 1);
    if (N <= laPrm_.plPoints.size()) {
      laPrm_.plPoints.clear();
      for (int k=0; k<N; ++k)       // use double + int
        laPrm_.plPoints.AddPoint(x0+k, eval(x0+k));
    }
  }
}